

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O1

void __thiscall bal::GraphMLStreamWriter::write_variables(GraphMLStreamWriter *this,Cnf *value)

{
  _func_int *p_Var1;
  char *name;
  long lVar2;
  Cnf *pCVar3;
  uint uVar4;
  int iVar5;
  formula_named_variables_t *pfVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  char *__s;
  undefined8 uStack_50;
  char acStack_48 [8];
  _Rb_tree_node_base *local_40;
  Cnf *local_38;
  
  uStack_50 = 0x10e404;
  uVar4 = (*(value->super_Formula)._vptr_Formula[1])(value);
  lVar2 = -((ulong)uVar4 + 0xf & 0xfffffffffffffff0);
  __s = acStack_48 + lVar2;
  p_Var1 = (value->super_Formula)._vptr_Formula[1];
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e420;
  uVar4 = (*p_Var1)(value);
  if (uVar4 != 0) {
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e430;
    memset(__s,0,(ulong)uVar4);
  }
  local_38 = value;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e43c;
  pfVar6 = Formula::get_named_variables_abi_cxx11_(&value->super_Formula);
  p_Var7 = (pfVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(pfVar6->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_40) {
    do {
      if (*(int *)&p_Var7[2]._M_parent != 0) {
        uVar8 = 0;
        do {
          uVar4 = *(uint *)(*(long *)(p_Var7 + 2) + uVar8 * 4);
          if (2 < uVar4 + 1) {
            uVar4 = (uVar4 >> 1) - 1;
            if (__s[uVar4] == '\0') {
              name = *(char **)(p_Var7 + 1);
              *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e494;
              write_variable(this,uVar4,name,(uint)uVar8);
              __s[uVar4] = '\x01';
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < *(uint *)&p_Var7[2]._M_parent);
      }
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e4a3;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_40);
  }
  pCVar3 = local_38;
  p_Var1 = (local_38->super_Formula)._vptr_Formula[1];
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e4ba;
  iVar5 = (*p_Var1)(pCVar3);
  if (iVar5 != 0) {
    uVar8 = 0;
    do {
      if (__s[uVar8] == '\0') {
        *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e4d5;
        write_variable(this,(variableid_t)uVar8,(char *)0x0,0);
        __s[uVar8] = '\x01';
      }
      uVar8 = uVar8 + 1;
      p_Var1 = (pCVar3->super_Formula)._vptr_Formula[1];
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10e4e7;
      uVar4 = (*p_Var1)(pCVar3);
    } while (uVar8 < uVar4);
  }
  return;
}

Assistant:

void write_variables(const Cnf& value) {
            bool is_processed[value.variables_size()];
            std::fill(is_processed, is_processed + value.variables_size(), false);
            
            const formula_named_variables_t& nv = value.get_named_variables();
            for (formula_named_variables_t::const_iterator it = nv.begin(); it != nv.end(); ++it) {
                const VariablesArray& nv_variables = it->second;
                const std::string& nv_name = it->first;
                for (auto i = 0; i < nv_variables.size(); i++) {
                    if (literal_t__is_variable(nv_variables.data()[i])) {
                        const variableid_t variable_id = literal_t__variable_id(nv_variables.data()[i]);
                        if (!is_processed[variable_id]) {
                            write_variable(variable_id, nv_name.c_str(), i);
                            is_processed[variable_id] = true;
                        };
                    };
                };
            };
            
            for (auto i = 0; i < value.variables_size(); i++) {
                if (!is_processed[i]) {
                    write_variable(i);
                    is_processed[i] = true;
                };
            };
        }